

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

bool __thiscall
glslang::HlslParseContext::isInputBuiltIn(HlslParseContext *this,TQualifier *qualifier)

{
  bool local_35;
  bool local_34;
  bool local_33;
  bool local_32;
  bool local_31;
  TQualifier *qualifier_local;
  HlslParseContext *this_local;
  
  switch(*(uint *)&qualifier->field_0x8 >> 7 & 0x1ff) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
    this_local._7_1_ =
         (this->super_TParseContextBase).super_TParseVersions.language == EShLangCompute;
    break;
  default:
    this_local._7_1_ = false;
    break;
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
    this_local._7_1_ =
         (this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex;
    break;
  case 0x1e:
  case 0x1f:
    local_31 = false;
    if (((this->super_TParseContextBase).super_TParseVersions.language != EShLangVertex) &&
       (local_31 = false,
       (this->super_TParseContextBase).super_TParseVersions.language != EShLangCompute)) {
      local_31 = (this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment;
    }
    this_local._7_1_ = local_31;
    break;
  case 0x21:
  case 0x22:
    local_32 = false;
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangVertex) {
      local_32 = (this->super_TParseContextBase).super_TParseVersions.language != EShLangCompute;
    }
    this_local._7_1_ = local_32;
    break;
  case 0x33:
    local_33 = true;
    if (((this->super_TParseContextBase).super_TParseVersions.language != EShLangTessControl) &&
       (local_33 = true,
       (this->super_TParseContextBase).super_TParseVersions.language != EShLangTessEvaluation)) {
      local_33 = (this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry;
    }
    this_local._7_1_ = local_33;
    break;
  case 0x34:
    local_35 = true;
    if (((this->super_TParseContextBase).super_TParseVersions.language != EShLangGeometry) &&
       (local_35 = true,
       (this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment)) {
      local_35 = (this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl
      ;
    }
    this_local._7_1_ = local_35;
    break;
  case 0x35:
  case 0x36:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
    this_local._7_1_ =
         (this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment;
    break;
  case 0x37:
    local_34 = true;
    if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangTessControl) {
      local_34 = (this->super_TParseContextBase).super_TParseVersions.language ==
                 EShLangTessEvaluation;
    }
    this_local._7_1_ = local_34;
    break;
  case 0x38:
  case 0x39:
    this_local._7_1_ =
         (this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation;
    break;
  case 0x3b:
    this_local._7_1_ =
         (this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation;
    break;
  case 0x50:
    this_local._7_1_ =
         (this->super_TParseContextBase).super_TParseVersions.language != EShLangCompute;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslParseContext::isInputBuiltIn(const TQualifier& qualifier) const
{
    switch (qualifier.builtIn) {
    case EbvPosition:
    case EbvPointSize:
        return language != EShLangVertex && language != EShLangCompute && language != EShLangFragment;
    case EbvClipDistance:
    case EbvCullDistance:
        return language != EShLangVertex && language != EShLangCompute;
    case EbvFragCoord:
    case EbvFace:
    case EbvHelperInvocation:
    case EbvLayer:
    case EbvPointCoord:
    case EbvSampleId:
    case EbvSampleMask:
    case EbvSamplePosition:
    case EbvViewportIndex:
        return language == EShLangFragment;
    case EbvGlobalInvocationId:
    case EbvLocalInvocationIndex:
    case EbvLocalInvocationId:
    case EbvNumWorkGroups:
    case EbvWorkGroupId:
    case EbvWorkGroupSize:
        return language == EShLangCompute;
    case EbvInvocationId:
        return language == EShLangTessControl || language == EShLangTessEvaluation || language == EShLangGeometry;
    case EbvPatchVertices:
        return language == EShLangTessControl || language == EShLangTessEvaluation;
    case EbvInstanceId:
    case EbvInstanceIndex:
    case EbvVertexId:
    case EbvVertexIndex:
        return language == EShLangVertex;
    case EbvPrimitiveId:
        return language == EShLangGeometry || language == EShLangFragment || language == EShLangTessControl;
    case EbvTessLevelInner:
    case EbvTessLevelOuter:
        return language == EShLangTessEvaluation;
    case EbvTessCoord:
        return language == EShLangTessEvaluation;
    case EbvViewIndex:
        return language != EShLangCompute;
    default:
        return false;
    }
}